

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboMultisampleTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::FboMultisampleTests::init(FboMultisampleTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  TestContext *testCtx;
  Context *pCVar2;
  TestNode *pTVar3;
  char *pcVar4;
  BasicFboMultisampleCase *pBVar5;
  FboMultisampleTests *pFVar6;
  Vector<int,_2> local_88;
  int local_80;
  int fmtNdx_1;
  int local_74;
  undefined1 local_6d;
  int fmtNdx;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  TestNode *local_20;
  TestCaseGroup *sampleCountGroup;
  int samples;
  int sampleCntNdx;
  FboMultisampleTests *this_local;
  
  sampleCountGroup._4_4_ = 0;
  pFVar6 = this;
  _samples = this;
  while ((int)sampleCountGroup._4_4_ < 3) {
    sampleCountGroup._0_4_ = init::sampleCounts[(int)sampleCountGroup._4_4_];
    pTVar3 = (TestNode *)operator_new(0x70);
    local_6d = 1;
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    de::toString<int>(&local_60,(int *)&sampleCountGroup);
    std::operator+(&local_40,&local_60,"_samples");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,testCtx,pcVar4,"");
    local_6d = 0;
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    local_20 = pTVar3;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    for (local_74 = 0; pTVar3 = local_20, local_74 < 0x10; local_74 = local_74 + 1) {
      pBVar5 = (BasicFboMultisampleCase *)operator_new(0xa0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      pcVar4 = FboTestUtil::getFormatName(init::colorFormats[local_74]);
      dVar1 = init::colorFormats[local_74];
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xffffffffffffff84,0x77,0x83);
      BasicFboMultisampleCase::BasicFboMultisampleCase
                (pBVar5,pCVar2,pcVar4,"",dVar1,0,(IVec2 *)&stack0xffffffffffffff84,
                 (int)sampleCountGroup);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar5);
    }
    for (local_80 = 0; pTVar3 = local_20, local_80 < 6; local_80 = local_80 + 1) {
      pBVar5 = (BasicFboMultisampleCase *)operator_new(0xa0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      pcVar4 = FboTestUtil::getFormatName(init::depthStencilFormats[local_80]);
      dVar1 = init::depthStencilFormats[local_80];
      tcu::Vector<int,_2>::Vector(&local_88,0x77,0x83);
      BasicFboMultisampleCase::BasicFboMultisampleCase
                (pBVar5,pCVar2,pcVar4,"",0x8058,dVar1,&local_88,(int)sampleCountGroup);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar5);
    }
    sampleCountGroup._4_4_ = sampleCountGroup._4_4_ + 1;
    pFVar6 = (FboMultisampleTests *)(ulong)sampleCountGroup._4_4_;
  }
  return (int)pFVar6;
}

Assistant:

void FboMultisampleTests::init (void)
{
	static const deUint32 colorFormats[] =
	{
		// RGBA formats
		GL_RGBA8,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGBA4,
		GL_RGB5_A1,

		// RGB formats
		GL_RGB8,
		GL_RGB565,

		// RG formats
		GL_RG8,

		// R formats
		GL_R8,

		// GL_EXT_color_buffer_float
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F
	};

	static const deUint32 depthStencilFormats[] =
	{
		GL_DEPTH_COMPONENT32F,
		GL_DEPTH_COMPONENT24,
		GL_DEPTH_COMPONENT16,
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8,
		GL_STENCIL_INDEX8
	};

	static const int sampleCounts[] = { 2, 4, 8 };

	for (int sampleCntNdx = 0; sampleCntNdx < DE_LENGTH_OF_ARRAY(sampleCounts); sampleCntNdx++)
	{
		int					samples				= sampleCounts[sampleCntNdx];
		tcu::TestCaseGroup*	sampleCountGroup	= new tcu::TestCaseGroup(m_testCtx, (de::toString(samples) + "_samples").c_str(), "");
		addChild(sampleCountGroup);

		// Color formats.
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
			sampleCountGroup->addChild(new BasicFboMultisampleCase(m_context, getFormatName(colorFormats[fmtNdx]), "", colorFormats[fmtNdx], GL_NONE, IVec2(119, 131), samples));

		// Depth/stencil formats.
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
			sampleCountGroup->addChild(new BasicFboMultisampleCase(m_context, getFormatName(depthStencilFormats[fmtNdx]), "", GL_RGBA8, depthStencilFormats[fmtNdx], IVec2(119, 131), samples));
	}
}